

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

void __thiscall DROPlayer::ScanInitBlock(DROPlayer *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  byte bVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  byte bVar5;
  UINT32 UVar6;
  uint uVar7;
  ulong in_RAX;
  UINT32 UVar8;
  ulong uVar9;
  uint uVar10;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar11;
  undefined8 uStack_38;
  
  this_00 = &this->_initRegSet;
  p_Var4 = &(this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar3;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
  uStack_38 = in_RAX & 0xffffffffffffff;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,(bool *)((long)&uStack_38 + 7));
  this->_initOPL3Enable = '\0';
  uVar9 = (ulong)(this->_fileHdr).dataOfs;
  if ((this->_fileHdr).verMajor < 2) {
    bVar5 = 0;
    uVar7 = 0;
    while (UVar6 = DataLoader_GetSize(this->_dLoad), uVar9 < UVar6) {
      bVar1 = this->_fileData[uVar9];
      if ((bVar1 & 0xfe) == 2) {
        bVar5 = bVar1 & 1;
        uVar9 = uVar9 + 1;
      }
      else {
        uVar10 = (uint)CONCAT11(bVar5,bVar1);
        if (uVar10 < uVar7) break;
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)uVar10);
        *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
        if (uVar10 == 0x105) {
          this->_initOPL3Enable = this->_fileData[uVar9 + 1];
        }
        uVar9 = (ulong)((int)uVar9 + 2);
        uVar7 = uVar10;
      }
    }
LAB_0010cb9d:
    UVar6 = DataLoader_GetSize(this->_dLoad);
    UVar8 = (UINT32)uVar9;
    if (UVar8 < UVar6) {
      bVar1 = this->_fileData[uVar9 & 0xffffffff];
      if (bVar1 < 2) goto LAB_0010cc14;
      if ((bVar1 & 0xfe) == 2) {
        bVar5 = bVar1 & 1;
        uVar9 = (ulong)(UVar8 + 1);
      }
      else {
        if ((bVar1 == 4) && (this->_fileData[UVar8 + 1] < 8)) goto LAB_0010cc14;
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (this_00,(ulong)(uint)CONCAT11(bVar5,bVar1));
        *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
        if (CONCAT11(bVar5,bVar1) == 0x105) {
          this->_initOPL3Enable = this->_fileData[UVar8 + 1];
        }
        uVar9 = (ulong)(UVar8 + 2);
      }
      goto LAB_0010cb9d;
    }
  }
  else {
    while( true ) {
      UVar6 = DataLoader_GetSize(this->_dLoad);
      UVar8 = (UINT32)uVar9;
      if (((UVar6 <= UVar8) ||
          (bVar5 = this->_fileData[uVar9], bVar5 == (this->_fileHdr).cmdDlyShort)) ||
         (bVar5 == (this->_fileHdr).cmdDlyLong)) break;
      uVar7 = bVar5 & 0x7f;
      if ((this->_fileHdr).regCmdCnt <= uVar7) break;
      uVar7 = CONCAT31((int3)((uint)bVar5 + (uint)bVar5 >> 8),(this->_fileHdr).regCmdMap[uVar7]);
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)uVar7);
      *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
      if (uVar7 == 0x105) {
        this->_initOPL3Enable = this->_fileData[UVar8 + 1];
      }
      uVar9 = (ulong)(UVar8 + 2);
    }
  }
LAB_0010cc14:
  this->_initBlkEndOfs = UVar8;
  return;
}

Assistant:

void DROPlayer::ScanInitBlock(void)
{
	// Scan initialization block of the DRO in order to be able to apply special fixes.
	// Fixes like:
	//	- DualOPL2 vs. OPL3 detection (because DOSBox sets hwType to DualOPL2 more often that it should)
	//	- [DRO v1] detect size of initialization block (for filtering out unescaped writes to register 01/04)
	UINT32 filePos;
	UINT8 curCmd;
	UINT8 selPort;
	UINT16 curReg;
	UINT16 lastReg;
	
	std::fill(_initRegSet.begin(), _initRegSet.end(), false);
	_initOPL3Enable = 0x00;
	
	filePos = _fileHdr.dataOfs;
	if (_fileHdr.verMajor < 2)
	{
		selPort = 0;
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				// make an exception for the chip select commands
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			
			curReg = (selPort << 8) | (curCmd << 0);
			if (curReg < lastReg)
				break;
			
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			lastReg = curReg;
			filePos += 0x02;
		}
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			
			if (curCmd == 0x00 || curCmd == 0x01)
				break;	// delay command - stop scanning
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			if (curCmd == 0x04)
			{
				if (_fileData[filePos + 0x01] < 0x08)
					break;	// properly escaped command - stop scanning
			}
			curReg = (selPort << 8) | (curCmd << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	else //if (_fileHdr.verMajor == 2)
	{
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == _fileHdr.cmdDlyShort || curCmd == _fileHdr.cmdDlyLong)
				break;
			
			if ((curCmd & 0x7F) >= _fileHdr.regCmdCnt)
				break;
			curReg = ((curCmd & 0x80) << 1) | (_fileHdr.regCmdMap[curCmd & 0x7F] << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	_initBlkEndOfs = filePos;
	
	return;
}